

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O0

void uv_os_free_passwd(uv_passwd_t *pwd)

{
  uv_passwd_t *pwd_local;
  
  if (pwd != (uv_passwd_t *)0x0) {
    uv__free(pwd->username);
    pwd->username = (char *)0x0;
    pwd->shell = (char *)0x0;
    pwd->homedir = (char *)0x0;
  }
  return;
}

Assistant:

void uv_os_free_passwd(uv_passwd_t* pwd) {
  if (pwd == NULL)
    return;

  /* On unix, the memory for name, shell, and homedir are allocated in a single
   * uv__malloc() call. The base of the pointer is stored in pwd->username, so
   * that is the field that needs to be freed.
   */
  uv__free(pwd->username);
#ifdef _WIN32
  uv__free(pwd->homedir);
#endif
  pwd->username = NULL;
  pwd->shell = NULL;
  pwd->homedir = NULL;
}